

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeConst<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type)

{
  float fVar1;
  double dVar2;
  uchar uVar3;
  unsigned_short uVar4;
  uint uVar5;
  unsigned_long uVar6;
  optional<unsigned_int> oVar7;
  bool bVar8;
  BasicType BVar9;
  uchar *puVar10;
  reference pvVar11;
  unsigned_short *puVar12;
  reference pvVar13;
  uint *puVar14;
  reference pvVar15;
  unsigned_long *puVar16;
  reference pvVar17;
  float *pfVar18;
  reference pvVar19;
  double *pdVar20;
  reference pvVar21;
  optional<unsigned_long> oVar22;
  optional<double> oVar23;
  allocator<char> local_4b1;
  string local_4b0;
  Err local_490;
  allocator<char> local_469;
  string local_468;
  Err local_448;
  _Storage<double,_true> local_428;
  optional<double> val_5;
  size_t i_5;
  array<double,_2UL> vals_5;
  allocator<char> local_3e9;
  string local_3e8;
  Err local_3c8;
  _Optional_payload_base<float> local_3a8;
  optional<float> val_4;
  size_t i_4;
  array<float,_4UL> vals_4;
  allocator<char> local_371;
  string local_370;
  Err local_350;
  _Storage<unsigned_long,_true> local_330;
  optional<unsigned_long> val_3;
  size_t i_3;
  array<unsigned_long,_2UL> vals_3;
  allocator<char> local_2f1;
  string local_2f0;
  Err local_2d0;
  _Optional_payload_base<unsigned_int> local_2b0;
  optional<unsigned_int> val_2;
  size_t i_2;
  array<unsigned_int,_4UL> vals_2;
  allocator<char> local_279;
  string local_278;
  Err local_258;
  _Optional_payload_base<unsigned_short> local_234;
  ulong uStack_230;
  optional<unsigned_short> val_1;
  size_t i_1;
  array<unsigned_short,_8UL> vals_1;
  allocator<char> local_201;
  string local_200;
  Err local_1e0;
  _Optional_payload_base<unsigned_char> local_1ba;
  ulong uStack_1b8;
  optional<unsigned_char> val;
  size_t i;
  array<unsigned_char,_16UL> vals;
  allocator<char> local_189;
  string local_188;
  Err local_168;
  _Storage<double,_true> local_148;
  optional<double> c_3;
  string local_130;
  Err local_110;
  _Optional_payload_base<float> local_ec;
  optional<float> c_2;
  Err local_c0;
  _Storage<unsigned_long,_true> local_a0;
  optional<unsigned_long> c_1;
  allocator<char> local_79;
  string local_78;
  Err local_58;
  _Optional_payload_base<unsigned_int> local_38;
  optional<unsigned_int> c;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  Type type_local;
  
  c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (_Optional_base<unsigned_int,_true,_true>)annotations;
  ctx_local = (ParseDeclsCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar8 = wasm::Type::isBasic((Type *)&ctx_local);
  if (!bVar8) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                  ,0x64f,
                  "Result<> wasm::WATParser::makeConst(Ctx &, Index, const std::vector<Annotation> &, Type) [Ctx = wasm::WATParser::ParseDeclsCtx]"
                 );
  }
  BVar9 = wasm::Type::getBasic((Type *)&ctx_local);
  switch(BVar9) {
  case none:
  case unreachable:
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                       ,0x6ad);
  case i32:
    local_38 = (_Optional_payload_base<unsigned_int>)Lexer::takeI32(&ctx->in);
    bVar8 = std::optional::operator_cast_to_bool((optional *)&local_38);
    oVar7 = c;
    if (bVar8) {
      puVar14 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_38);
      NullInstrParserCtx::makeI32Const
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                 (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  *)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>,*puVar14);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"expected i32",&local_79);
      Lexer::err(&local_58,&ctx->in,&local_78);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_58);
      wasm::Err::~Err(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    break;
  case i64:
    oVar22 = Lexer::takeI64(&ctx->in);
    local_a0._M_value =
         oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    c_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar8 = std::optional::operator_cast_to_bool((optional *)&local_a0);
    oVar7 = c;
    if (bVar8) {
      puVar16 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_a0);
      NullInstrParserCtx::makeI64Const
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                 (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  *)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>,*puVar16);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &c_2.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged,"expected i64",
                 (allocator<char> *)
                 ((long)&c_2.super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload + 3));
      Lexer::err(&local_c0,&ctx->in,
                 (string *)
                 &c_2.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
      wasm::Err::~Err(&local_c0);
      std::__cxx11::string::~string
                ((string *)
                 &c_2.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&c_2.super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload + 3));
    }
    break;
  case f32:
    local_ec = (_Optional_payload_base<float>)Lexer::takeF32(&ctx->in);
    bVar8 = std::optional::operator_cast_to_bool((optional *)&local_ec);
    oVar7 = c;
    if (bVar8) {
      pfVar18 = std::optional<float>::operator*((optional<float> *)&local_ec);
      NullInstrParserCtx::makeF32Const
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                 (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  *)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>,*pfVar18);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"expected f32",
                 (allocator<char> *)
                 &c_3.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      Lexer::err(&local_110,&ctx->in,&local_130);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_110);
      wasm::Err::~Err(&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &c_3.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
    }
    break;
  case f64:
    oVar23 = Lexer::takeF64(&ctx->in);
    local_148 = oVar23.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
    c_3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload._0_1_ =
         oVar23.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_engaged;
    bVar8 = std::optional::operator_cast_to_bool((optional *)&local_148);
    oVar7 = c;
    if (bVar8) {
      pdVar20 = std::optional<double>::operator*((optional<double> *)&local_148);
      NullInstrParserCtx::makeF64Const
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                 (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  *)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>,*pdVar20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"expected f64",&local_189);
      Lexer::err(&local_168,&ctx->in,&local_188);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_168);
      wasm::Err::~Err(&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    break;
  case v128:
    join_0x00000010_0x00000000_ = sv("i8x16",5);
    bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
    if (bVar8) {
      for (uStack_1b8 = 0; uStack_1b8 < 0x10; uStack_1b8 = uStack_1b8 + 1) {
        local_1ba = (_Optional_payload_base<unsigned_char>)Lexer::takeI8(&ctx->in);
        bVar8 = std::optional::operator_cast_to_bool((optional *)&local_1ba);
        if (!bVar8) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"expected i8 value",&local_201);
          Lexer::err(&local_1e0,&ctx->in,&local_200);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1e0);
          wasm::Err::~Err(&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator(&local_201);
          return __return_storage_ptr__;
        }
        puVar10 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_1ba);
        uVar3 = *puVar10;
        pvVar11 = std::array<unsigned_char,_16UL>::operator[]
                            ((array<unsigned_char,_16UL> *)&i,uStack_1b8);
        *pvVar11 = uVar3;
      }
      NullInstrParserCtx::makeI8x16Const
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                 (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>,(array<unsigned_char,_16UL> *)&i);
    }
    else {
      join_0x00000010_0x00000000_ = sv("i16x8",5);
      bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
      if (bVar8) {
        for (uStack_230 = 0; uStack_230 < 8; uStack_230 = uStack_230 + 1) {
          local_234 = (_Optional_payload_base<unsigned_short>)Lexer::takeI16(&ctx->in);
          bVar8 = std::optional::operator_cast_to_bool((optional *)&local_234);
          if (!bVar8) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"expected i16 value",&local_279);
            Lexer::err(&local_258,&ctx->in,&local_278);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_258);
            wasm::Err::~Err(&local_258);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator(&local_279);
            return __return_storage_ptr__;
          }
          puVar12 = std::optional<unsigned_short>::operator*((optional<unsigned_short> *)&local_234)
          ;
          uVar4 = *puVar12;
          pvVar13 = std::array<unsigned_short,_8UL>::operator[]
                              ((array<unsigned_short,_8UL> *)&i_1,uStack_230);
          *pvVar13 = uVar4;
        }
        NullInstrParserCtx::makeI16x8Const
                  (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                   (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>,(array<unsigned_short,_8UL> *)&i_1)
        ;
      }
      else {
        join_0x00000010_0x00000000_ = sv("i32x4",5);
        bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
        if (bVar8) {
          for (val_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> =
                    (_Optional_base<unsigned_int,_true,_true>)
                    (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
              (ulong)val_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> < 4;
              val_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> =
                   (_Optional_base<unsigned_int,_true,_true>)
                   ((long)val_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> + 1)) {
            local_2b0 = (_Optional_payload_base<unsigned_int>)Lexer::takeI32(&ctx->in);
            bVar8 = std::optional::operator_cast_to_bool((optional *)&local_2b0);
            if (!bVar8) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2f0,"expected i32 value",&local_2f1);
              Lexer::err(&local_2d0,&ctx->in,&local_2f0);
              Result<wasm::Ok>::Result(__return_storage_ptr__,&local_2d0);
              wasm::Err::~Err(&local_2d0);
              std::__cxx11::string::~string((string *)&local_2f0);
              std::allocator<char>::~allocator(&local_2f1);
              return __return_storage_ptr__;
            }
            puVar14 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2b0);
            uVar5 = *puVar14;
            pvVar15 = std::array<unsigned_int,_4UL>::operator[]
                                ((array<unsigned_int,_4UL> *)&i_2,
                                 (size_type)
                                 val_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>);
            *pvVar15 = uVar5;
          }
          NullInstrParserCtx::makeI32x4Const
                    (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                     (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>,(array<unsigned_int,_4UL> *)&i_2)
          ;
        }
        else {
          join_0x00000010_0x00000000_ = sv("i64x2",5);
          bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
          if (bVar8) {
            val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged = false;
            val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._9_7_ = 0;
            for (; (ulong)val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._8_8_ < 2;
                val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ =
                     val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._8_8_ + 1) {
              oVar22 = Lexer::takeI64(&ctx->in);
              local_330._M_value =
                   oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
              val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
                   oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged;
              bVar8 = std::optional::operator_cast_to_bool((optional *)&local_330);
              if (!bVar8) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_370,"expected i64 value",&local_371);
                Lexer::err(&local_350,&ctx->in,&local_370);
                Result<wasm::Ok>::Result(__return_storage_ptr__,&local_350);
                wasm::Err::~Err(&local_350);
                std::__cxx11::string::~string((string *)&local_370);
                std::allocator<char>::~allocator(&local_371);
                return __return_storage_ptr__;
              }
              puVar16 = std::optional<unsigned_long>::operator*
                                  ((optional<unsigned_long> *)&local_330);
              uVar6 = *puVar16;
              pvVar17 = std::array<unsigned_long,_2UL>::operator[]
                                  ((array<unsigned_long,_2UL> *)&i_3,
                                   val_3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                   super__Optional_payload_base<unsigned_long>._8_8_);
              *pvVar17 = uVar6;
            }
            NullInstrParserCtx::makeI64x2Const
                      (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int>,
                       (array<unsigned_long,_2UL> *)&i_3);
          }
          else {
            join_0x00000010_0x00000000_ = sv("f32x4",5);
            bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
            if (bVar8) {
              for (val_4.super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float> =
                        (_Optional_base<float,_true,_true>)
                        (_Optional_payload<float,_true,_true,_true>)0x0;
                  (ulong)val_4.super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float> < 4;
                  val_4.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float> =
                       (_Optional_base<float,_true,_true>)
                       ((long)val_4.super__Optional_base<float,_true,_true>._M_payload.
                              super__Optional_payload_base<float> + 1)) {
                local_3a8 = (_Optional_payload_base<float>)Lexer::takeF32(&ctx->in);
                bVar8 = std::optional::operator_cast_to_bool((optional *)&local_3a8);
                if (!bVar8) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3e8,"expected f32 value",&local_3e9);
                  Lexer::err(&local_3c8,&ctx->in,&local_3e8);
                  Result<wasm::Ok>::Result(__return_storage_ptr__,&local_3c8);
                  wasm::Err::~Err(&local_3c8);
                  std::__cxx11::string::~string((string *)&local_3e8);
                  std::allocator<char>::~allocator(&local_3e9);
                  return __return_storage_ptr__;
                }
                pfVar18 = std::optional<float>::operator*((optional<float> *)&local_3a8);
                fVar1 = *pfVar18;
                pvVar19 = std::array<float,_4UL>::operator[]
                                    ((array<float,_4UL> *)&i_4,
                                     (size_type)
                                     val_4.super__Optional_base<float,_true,_true>._M_payload.
                                     super__Optional_payload_base<float>);
                *pvVar19 = fVar1;
              }
              NullInstrParserCtx::makeF32x4Const
                        (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                         (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int>,(array<float,_4UL> *)&i_4);
            }
            else {
              join_0x00000010_0x00000000_ = sv("f64x2",5);
              bVar8 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
              if (bVar8) {
                val_5.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_engaged = false;
                val_5.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._9_7_ = 0;
                for (; (ulong)val_5.super__Optional_base<double,_true,_true>._M_payload.
                              super__Optional_payload_base<double>._8_8_ < 2;
                    val_5.super__Optional_base<double,_true,_true>._M_payload.
                    super__Optional_payload_base<double>._8_8_ =
                         val_5.super__Optional_base<double,_true,_true>._M_payload.
                         super__Optional_payload_base<double>._8_8_ + 1) {
                  oVar23 = Lexer::takeF64(&ctx->in);
                  local_428 = oVar23.super__Optional_base<double,_true,_true>._M_payload.
                              super__Optional_payload_base<double>._M_payload;
                  val_5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload._0_1_ =
                       oVar23.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged;
                  bVar8 = std::optional::operator_cast_to_bool((optional *)&local_428);
                  if (!bVar8) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_468,"expected f64 value",&local_469);
                    Lexer::err(&local_448,&ctx->in,&local_468);
                    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_448);
                    wasm::Err::~Err(&local_448);
                    std::__cxx11::string::~string((string *)&local_468);
                    std::allocator<char>::~allocator(&local_469);
                    return __return_storage_ptr__;
                  }
                  pdVar20 = std::optional<double>::operator*((optional<double> *)&local_428);
                  dVar2 = *pdVar20;
                  pvVar21 = std::array<double,_2UL>::operator[]
                                      ((array<double,_2UL> *)&i_5,
                                       val_5.super__Optional_base<double,_true,_true>._M_payload.
                                       super__Optional_payload_base<double>._8_8_);
                  *pvVar21 = dVar2;
                }
                NullInstrParserCtx::makeF64x2Const
                          (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,
                           (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            *)c.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_int>,(array<double,_2UL> *)&i_5)
                ;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4b0,"expected SIMD vector shape",&local_4b1);
                Lexer::err(&local_490,&ctx->in,&local_4b0);
                Result<wasm::Ok>::Result(__return_storage_ptr__,&local_490);
                wasm::Err::~Err(&local_490);
                std::__cxx11::string::~string((string *)&local_4b0);
                std::allocator<char>::~allocator(&local_4b1);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeConst(Ctx& ctx,
                   Index pos,
                   const std::vector<Annotation>& annotations,
                   Type type) {
  assert(type.isBasic());
  switch (type.getBasic()) {
    case Type::i32:
      if (auto c = ctx.in.takeI32()) {
        return ctx.makeI32Const(pos, annotations, *c);
      }
      return ctx.in.err("expected i32");
    case Type::i64:
      if (auto c = ctx.in.takeI64()) {
        return ctx.makeI64Const(pos, annotations, *c);
      }
      return ctx.in.err("expected i64");
    case Type::f32:
      if (auto c = ctx.in.takeF32()) {
        return ctx.makeF32Const(pos, annotations, *c);
      }
      return ctx.in.err("expected f32");
    case Type::f64:
      if (auto c = ctx.in.takeF64()) {
        return ctx.makeF64Const(pos, annotations, *c);
      }
      return ctx.in.err("expected f64");
    case Type::v128:
      if (ctx.in.takeKeyword("i8x16"sv)) {
        std::array<uint8_t, 16> vals;
        for (size_t i = 0; i < 16; ++i) {
          auto val = ctx.in.takeI8();
          if (!val) {
            return ctx.in.err("expected i8 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI8x16Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i16x8"sv)) {
        std::array<uint16_t, 8> vals;
        for (size_t i = 0; i < 8; ++i) {
          auto val = ctx.in.takeI16();
          if (!val) {
            return ctx.in.err("expected i16 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI16x8Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i32x4"sv)) {
        std::array<uint32_t, 4> vals;
        for (size_t i = 0; i < 4; ++i) {
          auto val = ctx.in.takeI32();
          if (!val) {
            return ctx.in.err("expected i32 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI32x4Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i64x2"sv)) {
        std::array<uint64_t, 2> vals;
        for (size_t i = 0; i < 2; ++i) {
          auto val = ctx.in.takeI64();
          if (!val) {
            return ctx.in.err("expected i64 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI64x2Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("f32x4"sv)) {
        std::array<float, 4> vals;
        for (size_t i = 0; i < 4; ++i) {
          auto val = ctx.in.takeF32();
          if (!val) {
            return ctx.in.err("expected f32 value");
          }
          vals[i] = *val;
        }
        return ctx.makeF32x4Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("f64x2"sv)) {
        std::array<double, 2> vals;
        for (size_t i = 0; i < 2; ++i) {
          auto val = ctx.in.takeF64();
          if (!val) {
            return ctx.in.err("expected f64 value");
          }
          vals[i] = *val;
        }
        return ctx.makeF64x2Const(pos, annotations, vals);
      }
      return ctx.in.err("expected SIMD vector shape");
    case Type::none:
    case Type::unreachable:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}